

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stronghold.cpp
# Opt level: O2

void __thiscall Stronghold::Stronghold(Stronghold *this,string *n,int t,int h,int m,int d)

{
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)n);
  BlackCard::BlackCard(&this->super_BlackCard,&local_50,t);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_001163f0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->honour = h;
  this->money = m;
  this->initialDefense = d;
  return;
}

Assistant:

Stronghold::Stronghold(string n, int t, int h, int m, int d) : BlackCard{n, t}
{
    name = n;
    honour = h;
    money = m;
    initialDefense = d;
}